

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O3

void __thiscall avro::MapSchema::MapSchema(MapSchema *this,Schema *valuesSchema)

{
  Node *pNVar1;
  
  pNVar1 = (Node *)operator_new(0x30);
  NodeMap::NodeMap((NodeMap *)pNVar1);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001823a0;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::Node>(&(this->super_Schema).node_,pNVar1);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_00182430;
  pNVar1 = (this->super_Schema).node_.px;
  Node::checkLock(pNVar1);
  (*pNVar1->_vptr_Node[0x12])(pNVar1,&valuesSchema->node_);
  return;
}

Assistant:

MapSchema::MapSchema(const Schema &valuesSchema) :
    Schema(new NodeMap)
{
    node_->addLeaf(valuesSchema.root());
}